

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_impl.c
# Opt level: O0

log_impl log_impl_create(char *name)

{
  log_impl plVar1;
  log_handle plVar2;
  char *in_RDI;
  size_t iterator;
  log_impl impl;
  ulong local_18;
  
  plVar1 = (log_impl)malloc(0x38);
  if (plVar1 != (log_impl)0x0) {
    plVar1->name = in_RDI;
    plVar2 = log_handle_create();
    plVar1->handle = plVar2;
    plVar1->level = LOG_LEVEL_INFO;
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      plVar1->aspects[local_18] = (log_aspect)0x0;
    }
  }
  return plVar1;
}

Assistant:

log_impl log_impl_create(const char *name)
{
	log_impl impl = malloc(sizeof(struct log_impl_type));

	if (impl != NULL)
	{
		size_t iterator;

		impl->name = name;
		impl->handle = log_handle_create();

#if !defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__)
		impl->level = LOG_LEVEL_DEBUG;
#else
		impl->level = LOG_LEVEL_INFO;
#endif

		for (iterator = 0; iterator < LOG_ASPECT_SIZE; ++iterator)
		{
			impl->aspects[iterator] = NULL;
		}
	}

	return impl;
}